

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorTiledVertical::RenderElement
          (DecoratorTiledVertical *this,Element *element,DecoratorDataHandle element_data)

{
  long lVar1;
  Vector2f VVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  CompiledShader local_58;
  undefined1 local_48 [24];
  
  VVar2 = Element::GetAbsoluteOffset(element,Padding);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = VVar2.x;
  local_48._4_4_ = VVar2.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  fVar5 = Math::Round(VVar2.x);
  fVar6 = Math::Round((float)local_48._4_4_);
  if (0 < *(int *)element_data) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(element_data + 8);
      texture = Decorator::GetTexture((Decorator *)this,(int)lVar4);
      local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
           (RenderManager *)0x0;
      local_58.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle =
           0;
      VVar2.y = fVar6;
      VVar2.x = fVar5;
      Geometry::Render((Geometry *)(lVar1 + lVar3),VVar2,texture,&local_58);
      CompiledShader::Release(&local_58);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < *(int *)element_data);
  }
  return;
}

Assistant:

void DecoratorTiledVertical::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	Vector2f translation = element->GetAbsoluteOffset(BoxArea::Padding).Round();
	DecoratorTiledVerticalData* data = reinterpret_cast<DecoratorTiledVerticalData*>(element_data);

	for (int i = 0; i < data->num_textures; i++)
		data->geometry[i].Render(translation, GetTexture(i));
}